

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TDeletingArray<SortNode_*,_SortNode_*>::~TDeletingArray
          (TDeletingArray<SortNode_*,_SortNode_*> *this)

{
  SortNode *pSVar1;
  ulong uVar2;
  
  if ((this->super_TArray<SortNode_*,_SortNode_*>).Count != 0) {
    uVar2 = 0;
    do {
      pSVar1 = (this->super_TArray<SortNode_*,_SortNode_*>).Array[uVar2];
      if (pSVar1 != (SortNode *)0x0) {
        operator_delete(pSVar1,0x30);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (this->super_TArray<SortNode_*,_SortNode_*>).Count);
  }
  TArray<SortNode_*,_SortNode_*>::~TArray(&this->super_TArray<SortNode_*,_SortNode_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}